

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-posix.c
# Opt level: O0

unsigned_short * mi_wcsdup(unsigned_short *s)

{
  void *dst;
  long in_RDI;
  unsigned_short *p;
  size_t size;
  size_t len;
  undefined8 local_18;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = (unsigned_short *)0x0;
  }
  else {
    for (local_18 = 0; *(short *)(in_RDI + local_18 * 2) != 0; local_18 = local_18 + 1) {
    }
    dst = (void *)((local_18 + 1) * 2);
    local_8 = (unsigned_short *)mi_malloc(0xadd195);
    if (local_8 != (unsigned_short *)0x0) {
      _mi_memcpy(dst,local_8,0xadd1b3);
    }
  }
  return local_8;
}

Assistant:

unsigned short* mi_wcsdup(const unsigned short* s) mi_attr_noexcept {
  if (s==NULL) return NULL;
  size_t len;
  for(len = 0; s[len] != 0; len++) { }
  size_t size = (len+1)*sizeof(unsigned short);
  unsigned short* p = (unsigned short*)mi_malloc(size);
  if (p != NULL) {
    _mi_memcpy(p,s,size);
  }
  return p;
}